

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  short sVar2;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> _Var3;
  __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
  __last;
  char cVar4;
  _Bool _Var5;
  FIELD *pFVar6;
  long *plVar7;
  long lVar8;
  cmCursesLongMessageForm *pcVar9;
  _func_int **pp_Var10;
  cmValue cVar11;
  char *pcVar12;
  __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
  _Var13;
  pointer ppfVar14;
  int iVar15;
  uint uVar16;
  FORM *pFVar17;
  uint uVar18;
  int key;
  string searchstr;
  char debugMessage [128];
  char local_1d2 [2];
  fieldnode *local_1d0;
  uint local_1c4;
  undefined1 *local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  long *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  __uniq_ptr_impl<cmState,_std::default_delete<cmState>_> local_180;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_178;
  bool local_158;
  undefined1 local_150 [48];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_120;
  bool local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f8;
  FIELD *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  string *local_e0;
  string local_d8;
  char local_b8 [136];
  
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    local_188 = &this->SearchString;
    local_e0 = (string *)&this->OldSearchString;
    local_e8 = &this->Outputs;
    pvVar1 = &this->HelpMessage;
    uVar18 = 0;
LAB_00159458:
    do {
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
      PrintKeys(this,0);
      if (this->SearchMode == true) {
        std::operator+((string *)&local_1c0,"Search: ",local_188);
        local_178._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_178._M_value + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_1c0,local_1c0 + (long)local_1b8);
        local_158 = true;
        UpdateStatusBar(this,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_178);
        if ((local_158 == true) &&
           (local_158 = false,
           local_178._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_178._M_value + 0x10)))
        {
          operator_delete((void *)local_178._M_value._M_dataplus._M_p,local_178._16_8_ + 1);
        }
        PrintKeys(this,1);
        move(uVar18 - 5);
        if (_stdscr == 0) {
          iVar15 = -1;
        }
        else {
          iVar15 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar15,1);
        refresh();
        if (local_1c0 != &local_1b0) {
          operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
        }
      }
      local_1c4 = wgetch(_stdscr);
      if (_stdscr != 0) {
        sVar2 = *(short *)(_stdscr + 6);
        uVar18 = (int)*(short *)(_stdscr + 4) + 1;
        if (*(short *)(_stdscr + 4) < 5 || sVar2 < 0x40) goto LAB_001595a1;
        pFVar6 = current_field((this->super_cmCursesForm).Form);
        plVar7 = (long *)field_userptr(pFVar6);
        if (this->SearchMode != true) {
          if ((plVar7 == (long *)0x0) ||
             (cVar4 = (**(code **)(*plVar7 + 0x10))(plVar7,&local_1c4,this,_stdscr), cVar4 == '\0'))
          goto LAB_001596d4;
          this->OkToGenerate = false;
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
          PrintKeys(this,0);
          goto switchD_0015973c_caseD_65;
        }
        if ((local_1c4 == 0x157) || (local_1c4 == 10)) {
          this->SearchMode = false;
          if ((this->SearchString)._M_string_length != 0) {
            JumpToCacheEntry(this,(this->SearchString)._M_dataplus._M_p);
            std::__cxx11::string::_M_assign(local_e0);
          }
          (this->SearchString)._M_string_length = 0;
          *(this->SearchString)._M_dataplus._M_p = '\0';
        }
        else if (((local_1c4 & 0xffffffdf) - 0x41 < 0x1a) ||
                (local_1c4 == 0x5f || local_1c4 - 0x30 < 10)) {
          if ((this->SearchString)._M_string_length < (ulong)(ushort)(sVar2 - 9)) {
            std::__cxx11::string::push_back((char)local_188);
          }
        }
        else if ((((local_1c4 == 8) || (local_1c4 == 0x14a)) || (local_1c4 == 0x107)) &&
                ((this->SearchString)._M_string_length != 0)) {
          std::__cxx11::string::pop_back();
        }
LAB_001596d4:
        if (this->SearchMode != false) goto switchD_0015973c_caseD_65;
        snprintf(local_b8,0x80,"Main form handling input, key: %d",(ulong)local_1c4);
        cmCursesForm::LogMessage(local_b8);
        if ((int)local_1c4 < 99) {
          if ((int)local_1c4 < 0x10) {
            if (local_1c4 == 4) {
LAB_001598e7:
              pFVar17 = (this->super_cmCursesForm).Form;
LAB_001598eb:
              iVar15 = 0x200;
              goto LAB_001599f0;
            }
            if (local_1c4 == 0xe) goto switchD_0015973c_caseD_6a;
          }
          else {
            if (local_1c4 == 0x10) goto switchD_0015973c_caseD_6b;
            if (local_1c4 == 0x15) {
LAB_001598d9:
              pFVar17 = (this->super_cmCursesForm).Form;
              iVar15 = 0x201;
              goto LAB_001599f0;
            }
            if (local_1c4 == 0x2f) {
              this->SearchMode = true;
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::optional<const_char_(&)[7],_true>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_120,(char (*) [7])"Search");
              UpdateStatusBar(this,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_120);
              if ((local_100 == true) &&
                 (local_100 = false,
                 local_120._M_value._M_dataplus._M_p !=
                 (_Alloc_hider)((long)&local_120._M_value + 0x10))) {
                operator_delete((void *)local_120._M_value._M_dataplus._M_p,local_120._16_8_ + 1);
              }
              PrintKeys(this,1);
              if (_stdscr == 0) {
                iVar15 = -1;
              }
              else {
                iVar15 = *(short *)(_stdscr + 4) + 1;
              }
              wtouchln(_stdscr,0,iVar15,1);
              refresh();
            }
          }
          goto switchD_0015973c_caseD_65;
        }
        if (0x101 < (int)local_1c4) {
          if ((int)local_1c4 < 0x152) {
            if (local_1c4 == 0x102) goto switchD_0015973c_caseD_6a;
            if (local_1c4 == 0x103) goto switchD_0015973c_caseD_6b;
          }
          else {
            if (local_1c4 == 0x152) goto LAB_001598e7;
            if (local_1c4 == 0x153) goto LAB_001598d9;
          }
          goto switchD_0015973c_caseD_65;
        }
        switch(local_1c4) {
        case 99:
          Configure(this,0);
          break;
        case 100:
          if ((this->NumberOfVisibleEntries != 0) && (this->IsEmpty == false)) {
            this->OkToGenerate = false;
            pFVar6 = current_field((this->super_cmCursesForm).Form);
            iVar15 = field_index(pFVar6);
            lVar8 = (long)iVar15;
            if (iVar15 == 2) {
              ppfVar14 = (this->Fields).
                         super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              local_1d0 = (fieldnode *)0x0;
            }
            else {
              ppfVar14 = (this->Fields).
                         super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              if (this->NumberOfVisibleEntries * 3 + -1 == lVar8) {
                local_1d0 = ppfVar14[lVar8 + -5];
              }
              else {
                local_1d0 = ppfVar14[lVar8 + 1];
              }
            }
            plVar7 = (long *)field_userptr(ppfVar14[lVar8 + -2]);
            if (plVar7 != (long *)0x0) {
              _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
              super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
                   (((this->CMakeInstance)._M_t.
                     super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                     super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                     super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
              local_190 = plVar7;
              pcVar12 = (char *)(**(code **)(*plVar7 + 0x28))();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c0,pcVar12,(allocator<char> *)local_150);
              cmState::RemoveCacheEntry
                        ((cmState *)
                         _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)&local_1c0);
              if (local_1c0 != &local_1b0) {
                operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
              }
              local_1c0 = &local_1b0;
              local_1b8 = (char *)0x0;
              local_1b0 = 0;
              if (local_1d0 != (FIELD *)0x0) {
                plVar7 = (long *)field_userptr(local_1d0);
                pcVar12 = (char *)(**(code **)(*plVar7 + 0x28))(plVar7);
                std::__cxx11::string::operator=((string *)&local_1c0,pcVar12);
              }
              if (_stdscr == 0) {
                uVar18 = 0xffffffff;
                uVar16 = 0xffffffff;
              }
              else {
                uVar18 = (int)*(short *)(_stdscr + 4) + 1;
                uVar16 = (int)*(short *)(_stdscr + 6) + 1;
              }
              pcVar12 = (char *)(**(code **)(*local_190 + 0x28))();
              RemoveEntry(this,pcVar12);
              RePost(this);
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (this,1,1,(ulong)uVar16,(ulong)uVar18);
              if ((local_1d0 != (fieldnode *)0x0) &&
                 (__last._M_current =
                       (this->Entries).
                       super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                 _Var13 = std::
                          find_if<__gnu_cxx::__normal_iterator<cmCursesCacheEntryComposite*,std::vector<cmCursesCacheEntryComposite,std::allocator<cmCursesCacheEntryComposite>>>,cmCursesMainForm::HandleInput()::__0>
                                    ((this->Entries).
                                     super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                                     ._M_impl.super__Vector_impl_data._M_start,__last,
                                     (string *)&local_1c0), _Var13._M_current != __last._M_current))
              {
                set_current_field((this->super_cmCursesForm).Form,
                                  (((_Var13._M_current)->Entry)._M_t.
                                   super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>
                                   .super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl)->
                                  Field);
              }
              if (local_1c0 != &local_1b0) {
                operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
              }
            }
          }
          break;
        case 0x67:
          if (this->OkToGenerate == true) {
            Generate(this);
            return;
          }
          break;
        case 0x68:
          if (_stdscr == 0) {
            uVar18 = 0xffffffff;
            local_1d0 = (fieldnode *)CONCAT44(local_1d0._4_4_,0xffffffff);
          }
          else {
            uVar18 = (int)*(short *)(_stdscr + 4) + 1;
            local_1d0 = (fieldnode *)CONCAT44(local_1d0._4_4_,*(short *)(_stdscr + 6) + 1);
          }
          local_f0 = current_field((this->super_cmCursesForm).Form);
          iVar15 = field_index(local_f0);
          plVar7 = (long *)field_userptr((this->Fields).
                                         super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [(long)iVar15 + -2]);
          local_190 = (long *)(**(code **)(*plVar7 + 0x28))(plVar7);
          local_180._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
          super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
               (((this->CMakeInstance)._M_t.
                 super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                 super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,(char *)local_190,(allocator<char> *)local_150);
          cVar11 = cmState::GetCacheEntryValue
                             ((cmState *)
                              local_180._M_t.
                              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                              super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
                              (string *)&local_1c0);
          if (local_1c0 != &local_1b0) {
            operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
          }
          local_f8 = pvVar1;
          if (cVar11.Value == (string *)0x0) {
LAB_00159cb7:
            std::__cxx11::string::operator=
                      ((string *)
                       ((pvVar1->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1),"");
          }
          else {
            _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
                 (((this->CMakeInstance)._M_t.
                   super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                   super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                   super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
                 super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1c0,(char *)local_190,(allocator<char> *)&local_d8);
            local_150._0_8_ = local_150 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"HELPSTRING","");
            cVar11 = cmState::GetCacheEntryProperty
                               ((cmState *)
                                _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
                                (string *)&local_1c0,(string *)local_150);
            if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
              operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
            }
            if (local_1c0 != &local_1b0) {
              operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
            }
            plVar7 = local_190;
            if (cVar11.Value == (string *)0x0) goto LAB_00159cb7;
            local_1c0 = (undefined1 *)0x13;
            local_1b8 = "Current option is: ";
            local_180._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
                 (tuple<cmState_*,_std::default_delete<cmState>_>)
                 (tuple<cmState_*,_std::default_delete<cmState>_>)cVar11;
            local_150._0_8_ = strlen((char *)local_190);
            local_150._8_8_ = plVar7;
            local_1d2[1] = 10;
            local_1d2[0] = '\n';
            cmStrCat<char,char[33],std::__cxx11::string,char>
                      (&local_d8,(cmAlphaNum *)&local_1c0,(cmAlphaNum *)local_150,local_1d2 + 1,
                       (char (*) [33])"Help string for this option is: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_180._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,local_1d2);
            std::__cxx11::string::operator=
                      ((string *)
                       ((pvVar1->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1),(string *)&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
          }
          pcVar9 = (cmCursesLongMessageForm *)operator_new(0x68);
          cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar9,local_f8,"Help",NoScroll);
          cmCursesForm::CurrentForm = (cmCursesForm *)pcVar9;
          (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[3])
                    (pcVar9,1,1,(ulong)local_1d0 & 0xffffffff,(ulong)uVar18);
          (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar9);
          cmCursesForm::CurrentForm = &this->super_cmCursesForm;
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                    (this,1,1,(ulong)local_1d0 & 0xffffffff,(ulong)uVar18);
          pFVar17 = (this->super_cmCursesForm).Form;
          pFVar6 = local_f0;
          goto LAB_00159d4f;
        case 0x6a:
switchD_0015973c_caseD_6a:
          pFVar6 = current_field((this->super_cmCursesForm).Form);
          iVar15 = field_index(pFVar6);
          if (this->NumberOfVisibleEntries * 3 + -1 == (long)iVar15) goto LAB_00159458;
          _Var5 = new_page((this->Fields).
                           super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)iVar15 + 1]);
          pFVar17 = (this->super_cmCursesForm).Form;
          if (_Var5) goto LAB_001598eb;
          iVar15 = 0x204;
LAB_001599f0:
          form_driver(pFVar17,iVar15);
          break;
        case 0x6b:
switchD_0015973c_caseD_6b:
          pFVar6 = current_field((this->super_cmCursesForm).Form);
          iVar15 = field_index(pFVar6);
          if (iVar15 == 2) goto LAB_00159458;
          _Var5 = new_page((this->Fields).
                           super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)iVar15 + -2]);
          pFVar17 = (this->super_cmCursesForm).Form;
          if (!_Var5) {
            iVar15 = 0x205;
            goto LAB_001599f0;
          }
          form_driver(pFVar17,0x201);
          pFVar17 = (this->super_cmCursesForm).Form;
          pFVar6 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)iVar15 + -3];
LAB_00159d4f:
          set_current_field(pFVar17,pFVar6);
          break;
        case 0x6c:
          if (_stdscr == 0) {
            uVar18 = 0xffffffff;
            local_1d0 = (fieldnode *)CONCAT44(local_1d0._4_4_,0xffffffff);
          }
          else {
            uVar18 = (int)*(short *)(_stdscr + 4) + 1;
            local_1d0 = (fieldnode *)CONCAT44(local_1d0._4_4_,*(short *)(_stdscr + 6) + 1);
          }
          pcVar9 = (cmCursesLongMessageForm *)operator_new(0x68);
          cmCursesLongMessageForm::cmCursesLongMessageForm
                    (pcVar9,local_e8,"CMake produced the following output",NoScroll);
          cmCursesForm::CurrentForm = (cmCursesForm *)pcVar9;
          (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[3])
                    (pcVar9,1,1,(ulong)local_1d0 & 0xffffffff,(ulong)uVar18);
          (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar9);
          pp_Var10 = (this->super_cmCursesForm)._vptr_cmCursesForm;
          uVar16 = (uint)local_1d0;
          cmCursesForm::CurrentForm = &this->super_cmCursesForm;
          goto LAB_00159aa2;
        case 0x6e:
          if ((this->OldSearchString)._M_string_length != 0) {
            JumpToCacheEntry(this,(this->OldSearchString)._M_dataplus._M_p);
          }
          break;
        case 0x71:
          goto switchD_0015973c_caseD_71;
        case 0x74:
          this->AdvancedMode = (bool)(this->AdvancedMode ^ 1);
          if (_stdscr == 0) {
            uVar18 = 0xffffffff;
            uVar16 = 0xffffffff;
          }
          else {
            uVar18 = (int)*(short *)(_stdscr + 4) + 1;
            uVar16 = (int)*(short *)(_stdscr + 6) + 1;
          }
          RePost(this);
          pp_Var10 = (this->super_cmCursesForm)._vptr_cmCursesForm;
LAB_00159aa2:
          (*pp_Var10[3])(this,1,1,(ulong)uVar16,(ulong)uVar18);
        }
switchD_0015973c_caseD_65:
        if (_stdscr == 0) {
          iVar15 = -1;
        }
        else {
          iVar15 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar15,1);
        wrefresh(_stdscr);
        goto LAB_00159458;
      }
      uVar18 = 0xffffffff;
LAB_001595a1:
    } while (local_1c4 != 0x71);
  }
switchD_0015973c_caseD_71:
  return;
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x = 0;
  int y = 0;

  if (!this->Form) {
    return;
  }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for (;;) {
    this->UpdateStatusBar();
    this->PrintKeys();
    if (this->SearchMode) {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar(searchstr);
      this->PrintKeys(1);
      curses_move(y - 5, static_cast<unsigned int>(searchstr.size()));
      // curses_move(1,1);
      touchwin(stdscr);
      refresh();
    }
    int key = getch();

#ifdef _WIN32
    if (key == KEY_RESIZE) {
      HandleResize();
    }
#endif // _WIN32

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        break;
      }
      continue;
    }

    currentField = current_field(this->Form);
    currentWidget =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));

    bool widgetHandled = false;

    if (this->SearchMode) {
      if (key == 10 || key == KEY_ENTER) {
        this->SearchMode = false;
        if (!this->SearchString.empty()) {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
        }
        this->SearchString.clear();
      }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') || (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') || (key == '_')) {
        if (this->SearchString.size() <
            static_cast<std::string::size_type>(x - 10)) {
          this->SearchString += static_cast<char>(key);
        }
      } else if (key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC) {
        if (!this->SearchString.empty()) {
          this->SearchString.pop_back();
        }
      }
    } else if (currentWidget && !this->SearchMode) {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled) {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
      }
    }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode) {
      // If the current widget does not want to handle input,
      // we handle it.
      snprintf(debugMessage, sizeof(debugMessage),
               "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if (key == 'q') {
        break;
      }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow down, ctrl+n (emacs binding), or j (vim
      // binding)
      if (key == KEY_DOWN || key == ctrl('n') || key == 'j') {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          continue;
        }
        if (new_page(this->Fields[findex + 1])) {
          form_driver(this->Form, REQ_NEXT_PAGE);
        } else {
          form_driver(this->Form, REQ_NEXT_FIELD);
        }
      }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow up, ctrl+p (emacs binding), or k (vim binding)
      else if (key == KEY_UP || key == ctrl('p') || key == 'k') {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if (findex == 2) {
          continue;
        }
        if (new_page(this->Fields[findex - 2])) {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex - 3]);
        } else {
          form_driver(this->Form, REQ_PREV_FIELD);
        }
      }
      // pg down
      else if (key == KEY_NPAGE || key == ctrl('d')) {
        form_driver(this->Form, REQ_NEXT_PAGE);
      }
      // pg up
      else if (key == KEY_PPAGE || key == ctrl('u')) {
        form_driver(this->Form, REQ_PREV_PAGE);
      }
      // configure
      else if (key == 'c') {
        this->Configure();
      }
      // display help
      else if (key == 'h') {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        const char* curField = lbl->GetValue();
        cmValue helpString = nullptr;

        cmValue existingValue =
          this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
        if (existingValue) {
          helpString = this->CMakeInstance->GetState()->GetCacheEntryProperty(
            curField, "HELPSTRING");
        }
        if (helpString) {
          this->HelpMessage[1] =
            cmStrCat("Current option is: ", curField, '\n',
                     "Help string for this option is: ", *helpString, '\n');
        } else {
          this->HelpMessage[1] = "";
        }

        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->HelpMessage, "Help",
          cmCursesLongMessageForm::ScrollBehavior::NoScroll);
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
        set_current_field(this->Form, cur);
      }
      // display last errors
      else if (key == 'l') {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->Outputs, "CMake produced the following output",
          cmCursesLongMessageForm::ScrollBehavior::NoScroll);
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
      } else if (key == '/') {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
      } else if (key == 'n') {
        if (!this->OldSearchString.empty()) {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
        }
      }
      // switch advanced on/off
      else if (key == 't') {
        this->AdvancedMode = !this->AdvancedMode;
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
      }
      // generate and exit
      else if (key == 'g') {
        if (this->OkToGenerate) {
          this->Generate();
          break;
        }
      }
      // delete cache entry
      else if (key == 'd' && this->NumberOfVisibleEntries && !this->IsEmpty) {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if (findex == 2) {
          nextCur = nullptr;
        } else if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          nextCur = this->Fields[findex - 5];
        } else {
          nextCur = this->Fields[findex + 1];
        }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        if (lbl) {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur) {
            nextVal =
              (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))
                 ->GetValue());
          }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur) {
            // make the next or prev. current field after deletion
            auto nextEntryIt = std::find_if(
              this->Entries.begin(), this->Entries.end(),
              [&nextVal](cmCursesCacheEntryComposite const& entry) {
                return nextVal == entry.Key;
              });

            if (nextEntryIt != this->Entries.end()) {
              set_current_field(this->Form, nextEntryIt->Entry->Field);
            }
          }
        }
      }
    }

    touchwin(stdscr);
    wrefresh(stdscr);
  }
}